

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::RandomBernoulliLikeLayerParams::SerializeWithCachedSizes
          (RandomBernoulliLikeLayerParams *this,CodedOutputStream *output)

{
  float value;
  
  if (this->seed_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->seed_,output);
  }
  value = this->prob_;
  if ((value == 0.0) && (!NAN(value))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteFloat(2,value,output);
  return;
}

Assistant:

void RandomBernoulliLikeLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.RandomBernoulliLikeLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->seed() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->seed(), output);
  }

  // float prob = 2;
  if (this->prob() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->prob(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.RandomBernoulliLikeLayerParams)
}